

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddCustomCommandToOutput
               (void *arg,char *output,char *command,int numArgs,char **args,char *main_dependency,
               int numDepends,char **depends)

{
  pointer *this;
  char *pcVar1;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  char *local_150;
  char *no_working_dir;
  char *no_comment;
  value_type local_138;
  int local_114;
  undefined1 local_110 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  cmCustomCommandLines commandLines;
  value_type local_d8;
  int local_b8;
  allocator local_b1;
  int i;
  allocator local_79;
  undefined1 local_78 [8];
  string expand;
  cmCustomCommandLine commandLine;
  cmMakefile *mf;
  char *main_dependency_local;
  char **args_local;
  int numArgs_local;
  char *command_local;
  char *output_local;
  void *arg_local;
  
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,command,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,pcVar1,&local_b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&expand.field_2 + 8),(value_type *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  for (local_b8 = 0; local_b8 < numArgs; local_b8 = local_b8 + 1) {
    std::__cxx11::string::operator=((string *)local_78,args[local_b8]);
    pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,pcVar1,
               (allocator *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&expand.field_2 + 8),&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  this = &depends2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)this);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)this,
             (value_type *)((long)&expand.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110);
  for (local_114 = 0; local_114 < numDepends; local_114 = local_114 + 1) {
    std::__cxx11::string::operator=((string *)local_78,depends[local_114]);
    pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,pcVar1,(allocator *)((long)&no_comment + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_110,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&no_comment + 7));
  }
  no_working_dir = (char *)0x0;
  local_150 = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,output,&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,main_dependency,&local_199);
  cmMakefile::AddCustomCommandToOutput
            ((cmMakefile *)arg,&local_170,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_110,&local_198,
             (cmCustomCommandLines *)
             &depends2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,no_working_dir,local_150,false,true
             ,false);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &depends2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_78);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  return;
}

Assistant:

void CCONV cmAddCustomCommandToOutput(void *arg, const char* output,
                                const char* command,
                                int numArgs, const char **args,
                                const char* main_dependency,
                                int numDepends, const char **depends)
{
  // Get the makefile instance.  Perform an extra variable expansion
  // now because the API caller expects it.
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  // Construct the command line for the command.
  cmCustomCommandLine commandLine;
  std::string expand = command;
  commandLine.push_back(mf->ExpandVariablesInString(expand));
  for(int i=0; i < numArgs; ++i)
    {
    expand = args[i];
    commandLine.push_back(mf->ExpandVariablesInString(expand));
    }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Accumulate the list of dependencies.
  std::vector<std::string> depends2;
  for(int i = 0; i < numDepends; ++i)
    {
    expand = depends[i];
    depends2.push_back(mf->ExpandVariablesInString(expand));
    }

  // Pass the call to the makefile instance.
  const char* no_comment = 0;
  const char* no_working_dir = 0;
  mf->AddCustomCommandToOutput(output, depends2, main_dependency,
                               commandLines, no_comment, no_working_dir);
}